

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Transform * phyr::Transform::rotate(Transform *__return_storage_ptr__,Vector3f *axis,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar3 = cos(theta * 0.017453292519943295);
  dVar4 = sin(theta * 0.017453292519943295);
  dVar7 = 1.0 - dVar3;
  dVar11 = axis->z;
  dVar6 = dVar11 * dVar11 * dVar7 + dVar3;
  dVar1 = axis->x;
  dVar2 = axis->y;
  dVar9 = dVar1 * dVar1 * dVar7 + dVar3;
  dVar10 = dVar1 * dVar2 * dVar7 + -dVar11 * dVar4;
  (__return_storage_ptr__->mat).d[0][0] = dVar9;
  (__return_storage_ptr__->mat).d[0][1] = dVar10;
  (__return_storage_ptr__->mat).d[0][3] = 0.0;
  dVar8 = dVar1 * dVar2 * dVar7 + dVar4 * dVar11;
  dVar3 = dVar2 * dVar2 * dVar7 + dVar3;
  (__return_storage_ptr__->mat).d[1][0] = dVar8;
  (__return_storage_ptr__->mat).d[1][1] = dVar3;
  (__return_storage_ptr__->mat).d[1][3] = 0.0;
  dVar5 = dVar11 * dVar1 * dVar7;
  dVar7 = dVar11 * dVar2 * dVar7;
  dVar11 = -dVar2 * dVar4 + dVar5;
  dVar12 = dVar1 * dVar4 + dVar7;
  (__return_storage_ptr__->mat).d[2][0] = dVar11;
  (__return_storage_ptr__->mat).d[2][1] = dVar12;
  (__return_storage_ptr__->mat).d[2][2] = dVar6;
  (__return_storage_ptr__->mat).d[2][3] = 0.0;
  (__return_storage_ptr__->mat).d[3][0] = 0.0;
  (__return_storage_ptr__->mat).d[3][1] = 0.0;
  (__return_storage_ptr__->mat).d[3][2] = 0.0;
  (__return_storage_ptr__->mat).d[3][3] = 1.0;
  (__return_storage_ptr__->invMat).d[0][0] = dVar9;
  (__return_storage_ptr__->invMat).d[0][1] = dVar8;
  (__return_storage_ptr__->invMat).d[0][2] = dVar11;
  (__return_storage_ptr__->invMat).d[0][3] = 0.0;
  (__return_storage_ptr__->invMat).d[1][0] = dVar10;
  (__return_storage_ptr__->invMat).d[1][1] = dVar3;
  (__return_storage_ptr__->invMat).d[1][2] = dVar12;
  (__return_storage_ptr__->invMat).d[1][3] = 0.0;
  dVar5 = dVar2 * dVar4 + dVar5;
  dVar7 = -dVar1 * dVar4 + dVar7;
  (__return_storage_ptr__->mat).d[0][2] = dVar5;
  (__return_storage_ptr__->mat).d[1][2] = dVar7;
  (__return_storage_ptr__->invMat).d[2][0] = dVar5;
  (__return_storage_ptr__->invMat).d[2][1] = dVar7;
  (__return_storage_ptr__->invMat).d[2][2] = dVar6;
  (__return_storage_ptr__->invMat).d[3][1] = 0.0;
  (__return_storage_ptr__->invMat).d[3][2] = 0.0;
  (__return_storage_ptr__->invMat).d[2][3] = 0.0;
  (__return_storage_ptr__->invMat).d[3][0] = 0.0;
  (__return_storage_ptr__->invMat).d[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::rotate(const Vector3f& axis, Real theta) {
    Real cosTheta = std::cos(radians(theta));
    Real sinTheta = std::sin(radians(theta));
    Mat4x4 m;

    // Axis angle to rotation matrix
    m.d[0][0] = cosTheta + axis.x * axis.x * (1 - cosTheta);
    m.d[0][1] = axis.x * axis.y * (1 - cosTheta) - axis.z * sinTheta;
    m.d[0][2] = axis.x * axis.z * (1 - cosTheta) + axis.y * sinTheta;
    m.d[0][3] = 0;

    m.d[1][0] = axis.x * axis.y * (1 - cosTheta) + axis.z * sinTheta;
    m.d[1][1] = cosTheta + axis.y * axis.y * (1 - cosTheta);
    m.d[1][2] = axis.y * axis.z * (1 - cosTheta) - axis.x * sinTheta;
    m.d[1][3] = 0;

    m.d[2][0] = axis.x * axis.z * (1 - cosTheta) - axis.y * sinTheta;
    m.d[2][1] = axis.y * axis.z * (1 - cosTheta) + axis.x * sinTheta;
    m.d[2][2] = cosTheta + axis.z * axis.z * (1 - cosTheta);
    m.d[2][3] = 0;

    return Transform(m, Mat4x4::transpose(m));
}